

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O2

void __thiscall Assimp::SMDImporter::FixTimeValues(SMDImporter *this)

{
  int iVar1;
  pointer pBVar2;
  pointer pMVar3;
  double dVar4;
  double dVar5;
  
  iVar1 = this->iSmallestFrame;
  dVar4 = 0.0;
  for (pBVar2 = (this->asBones).
                super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
                super__Vector_impl_data._M_start;
      pBVar2 != (this->asBones).
                super__Vector_base<Assimp::SMD::Bone,_std::allocator<Assimp::SMD::Bone>_>._M_impl.
                super__Vector_impl_data._M_finish; pBVar2 = pBVar2 + 1) {
    for (pMVar3 = (pBVar2->sAnim).asKeys.
                  super__Vector_base<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pMVar3 != (pBVar2->sAnim).asKeys.
                  super__Vector_base<Assimp::SMD::Bone::Animation::MatrixKey,_std::allocator<Assimp::SMD::Bone::Animation::MatrixKey>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pMVar3 = pMVar3 + 1) {
      dVar5 = pMVar3->dTime - (double)iVar1;
      pMVar3->dTime = dVar5;
      if (dVar5 <= dVar4) {
        dVar5 = dVar4;
      }
      dVar4 = dVar5;
    }
  }
  this->dLengthOfAnim = dVar4;
  return;
}

Assistant:

void SMDImporter::FixTimeValues() {
    double dDelta = (double)iSmallestFrame;
    double dMax = 0.0f;
    for (std::vector<SMD::Bone>::iterator
            iBone =  asBones.begin();
            iBone != asBones.end();++iBone) {
        for (std::vector<SMD::Bone::Animation::MatrixKey>::iterator
                iKey =  (*iBone).sAnim.asKeys.begin();
                iKey != (*iBone).sAnim.asKeys.end();++iKey) {
            (*iKey).dTime -= dDelta;
            dMax = std::max(dMax, (*iKey).dTime);
        }
    }
    dLengthOfAnim = dMax;
}